

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QString * QUtf8::convertToUnicode(QByteArrayView in)

{
  QByteArrayView in_00;
  QChar *pQVar1;
  QChar *pQVar2;
  __off_t __length;
  storage_type *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QChar *end;
  QChar *data;
  QString *result;
  QString *this;
  QString *in_stack_ffffffffffffffb8;
  QString *pQVar3;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  pQVar3 = in_RDI;
  local_18.m_size = (qsizetype)in_RSI;
  QByteArrayView::size(&local_18);
  QString::QString(in_stack_ffffffffffffffb8,(qsizetype)this,(Initialization)((ulong)in_RDI >> 0x20)
                  );
  pQVar1 = QString::constData((QString *)0x15dc29);
  in_00.m_data = (storage_type *)local_18.m_size;
  in_00.m_size = (qsizetype)pQVar3;
  pQVar2 = convertToUnicode((QChar *)in_stack_ffffffffffffffb8,in_00);
  QString::truncate(this,(char *)((long)pQVar2 - (long)pQVar1 >> 1),__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QUtf8::convertToUnicode(QByteArrayView in)
{
    // UTF-8 to UTF-16 always needs the exact same number of words or less:
    //    UTF-8     UTF-16
    //   1 byte     1 word
    //   2 bytes    1 word
    //   3 bytes    1 word
    //   4 bytes    2 words (one surrogate pair)
    // That is, we'll use the full buffer if the input is US-ASCII (1-byte UTF-8),
    // half the buffer for U+0080-U+07FF text (e.g., Greek, Cyrillic, Arabic) or
    // non-BMP text, and one third of the buffer for U+0800-U+FFFF text (e.g, CJK).
    //
    // The table holds for invalid sequences too: we'll insert one replacement char
    // per invalid byte.
    QString result(in.size(), Qt::Uninitialized);
    QChar *data = const_cast<QChar*>(result.constData()); // we know we're not shared
    const QChar *end = convertToUnicode(data, in);
    result.truncate(end - data);
    return result;
}